

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

void merge_cache_lcp_2way<true,unsigned_short>
               (uchar **from0,lcp_t *lcp_input0,unsigned_short *cache_input0,size_t n0,uchar **from1
               ,lcp_t *lcp_input1,unsigned_short *cache_input1,size_t n1,uchar **result,
               lcp_t *lcp_result,unsigned_short *cache_result)

{
  uchar *puVar1;
  uchar *puVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  size_t sVar6;
  ushort c;
  uchar **__dest;
  ushort *puVar7;
  ushort c_00;
  lcp_t lVar8;
  bool bVar9;
  bool bVar10;
  ulong local_c8;
  size_t local_c0;
  lcp_t *local_b8;
  uchar **local_b0;
  uchar **local_a8;
  uint16_t *local_a0;
  uint16_t *local_98;
  lcp_t *local_90;
  size_t local_80;
  string local_70;
  string local_50;
  
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"merge_cache_lcp_2way",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(): n0=",7);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", n1=",5);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  local_70._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_70,1);
  check_input<unsigned_short>(from0,lcp_input0,cache_input0,n0);
  local_80 = n1;
  check_input<unsigned_short>(from1,lcp_input1,cache_input1,n1);
  local_a0 = cache_input0 + 1;
  c = *cache_input0;
  local_98 = cache_input1 + 1;
  c_00 = *cache_input1;
  local_b0 = from1;
  local_90 = lcp_input1;
  if (c < c_00) {
    puVar1 = *from0;
    if (puVar1 == (uchar *)0x0) {
LAB_0024896b:
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x51,"int cmp(const unsigned char *, const unsigned char *)");
    }
    puVar2 = *from1;
    if (puVar2 == (uchar *)0x0) {
LAB_0024898a:
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x52,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar3 = strcmp((char *)puVar1,(char *)puVar2);
    if (-1 < iVar3) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x449,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                   );
    }
    bVar9 = (c & 0xff00) != 0;
    bVar10 = (c & 0xff00) == (c_00 & 0xff00);
    if (bVar10 && bVar9) {
      if (puVar2[1] == '\0') {
        c_00 = 0;
      }
      else {
        c_00 = CONCAT11(puVar2[1],puVar2[2]);
      }
    }
    *result = puVar1;
    *cache_result = c;
    uVar5 = (ulong)(bVar10 && bVar9);
    goto joined_r0x00247ccf;
  }
  local_c0 = n0;
  local_b8 = lcp_input0;
  local_a8 = from0;
  if (c_00 < c) {
    puVar1 = *from0;
    if (puVar1 == (uchar *)0x0) goto LAB_0024896b;
    puVar2 = *from1;
    if (puVar2 == (uchar *)0x0) goto LAB_0024898a;
    iVar3 = strcmp((char *)puVar1,(char *)puVar2);
    if (iVar3 < 1) {
      __assert_fail("cmp(*from0, *from1) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x45c,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                   );
    }
    bVar9 = (c & 0xff00) != 0;
    bVar10 = (c & 0xff00) == (c_00 & 0xff00);
    if (bVar10 && bVar9) {
      if (puVar1[1] == '\0') {
        c = 0;
      }
      else {
        c = CONCAT11(puVar1[1],puVar1[2]);
      }
    }
    *result = puVar2;
    *cache_result = c_00;
    local_c8 = (ulong)(bVar10 && bVar9);
    local_80 = n1 - 1;
    if (local_80 != 0) {
      local_b0 = from1 + 1;
      uVar5 = *lcp_input1;
      local_90 = lcp_input1 + 1;
      c_00 = cache_input1[1];
      local_98 = cache_input1 + 2;
      goto LAB_00247dc1;
    }
LAB_00248748:
    puVar7 = cache_result + 1;
    __dest = result + 1;
LAB_0024874d:
    if (local_c0 == 0) {
      __assert_fail("n0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x527,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                   );
    }
    *lcp_result = local_c8;
    *puVar7 = c;
    memmove(__dest,local_a8,local_c0 * 8);
    memmove(lcp_result + 1,local_b8,local_c0 * 8);
    local_98 = local_a0;
    local_80 = local_c0;
    goto LAB_002488eb;
  }
  if ((char)c == '\0') {
    puVar1 = *from0;
    if (puVar1 == (uchar *)0x0) goto LAB_0024896b;
    if (*from1 == (uchar *)0x0) goto LAB_0024898a;
    iVar3 = strcmp((char *)puVar1,(char *)*from1);
    if (iVar3 != 0) {
      __assert_fail("cmp(*from0, *from1) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x470,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                   );
    }
    if (c != 0) {
LAB_00248a63:
      __assert_fail("a != b or a==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x3f6,"unsigned int lcp(uint16_t, uint16_t)");
    }
    *result = puVar1;
    *cache_result = 0;
    uVar5 = 0;
    c_00 = 0;
joined_r0x00247ccf:
    if (n0 != 1) {
      local_c8 = *lcp_input0;
      c = cache_input0[1];
LAB_00247d07:
      local_b8 = lcp_input0 + 1;
      local_a8 = from0 + 1;
      local_c0 = n0 - 1;
      local_a0 = cache_input0 + 2;
LAB_00247dc1:
      puVar7 = cache_result + 1;
      __dest = result + 1;
LAB_00247dc9:
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Starting loop, n0=",0x12);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", n1=",5);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ...\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tprev   = \'",0xb);
      puVar1 = __dest[-1];
      iVar3 = (int)poVar4;
      if (puVar1 == (uchar *)0x0) {
        std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar6 = strlen((char *)puVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)puVar1,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t*from0 = \'",0xb);
      puVar1 = *local_a8;
      if (puVar1 == (uchar *)0x0) {
        std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar6 = strlen((char *)puVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)puVar1,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t*from1 = \'",0xb);
      puVar1 = *local_b0;
      if (puVar1 == (uchar *)0x0) {
        std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar6 = strlen((char *)puVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)puVar1,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tlcp0   = ",10);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tlcp1   = ",10);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tcache0 = \'",0xb);
      to_str_abi_cxx11_(&local_70,c);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,
                                                  local_70._M_dataplus._M_p._0_1_),
                          CONCAT44(local_70._M_string_length._4_4_,(int)local_70._M_string_length));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tcache1 = \'",0xb);
      to_str_abi_cxx11_(&local_50,c_00);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_) !=
          &local_70.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_));
      }
      check_lcp_and_cache<unsigned_short>(__dest[-1],*local_a8,local_c8,c,*local_b0,uVar5,c_00);
      if (uVar5 < local_c8) {
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tlcp0 > lcp1\n",0xd);
        puVar1 = *local_a8;
        if (puVar1 == (uchar *)0x0) goto LAB_0024896b;
        if (*local_b0 == (uchar *)0x0) goto LAB_0024898a;
        iVar3 = strcmp((char *)puVar1,(char *)*local_b0);
        if (-1 < iVar3) {
          __assert_fail("cmp(*from0, *from1) < 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x4ae,
                        "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                       );
        }
        *__dest = puVar1;
        *lcp_result = local_c8;
        *puVar7 = c;
LAB_0024818b:
        local_c8 = *local_b8;
        c = *local_a0;
      }
      else {
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        if (local_c8 < uVar5) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tlcp0 < lcp1\n",0xd);
          if (*local_a8 == (uchar *)0x0) goto LAB_0024896b;
          puVar1 = *local_b0;
          if (puVar1 == (uchar *)0x0) goto LAB_0024898a;
          iVar3 = strcmp((char *)*local_a8,(char *)puVar1);
          if (iVar3 < 1) {
            __assert_fail("cmp(*from0, *from1) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4b7,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                         );
          }
          *__dest = puVar1;
          *lcp_result = uVar5;
LAB_00248264:
          *puVar7 = c_00;
          lVar8 = *local_90;
          c_00 = *local_98;
LAB_002482a0:
          local_90 = local_90 + 1;
          local_98 = local_98 + 1;
          puVar7 = puVar7 + 1;
          lcp_result = lcp_result + 1;
          local_b0 = local_b0 + 1;
          __dest = __dest + 1;
          local_80 = local_80 - 1;
          uVar5 = lVar8;
          if (local_80 == 0) goto LAB_0024874d;
          goto LAB_00247dc9;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tlcp0 == lcp1\n",0xe);
        if (c < c_00) {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\tcache0 < cache1\n",0x12);
          puVar1 = *local_a8;
          if (puVar1 != (uchar *)0x0) {
            puVar2 = *local_b0;
            if (puVar2 != (uchar *)0x0) {
              iVar3 = strcmp((char *)puVar1,(char *)puVar2);
              if (-1 < iVar3) {
                __assert_fail("cmp(*from0, *from1) < 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                              ,0x4c6,
                              "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                             );
              }
              if (((c & 0xff00) != 0) && ((c & 0xff00) == (c_00 & 0xff00))) {
                if (puVar2[uVar5 + 1] == '\0') {
                  c_00 = 0;
                  uVar5 = uVar5 + 1;
                }
                else {
                  c_00 = CONCAT11(puVar2[uVar5 + 1],puVar2[uVar5 + 2]);
                  uVar5 = uVar5 + 1;
                }
              }
              *__dest = puVar1;
              *lcp_result = local_c8;
              *puVar7 = c;
              goto LAB_0024818b;
            }
            goto LAB_0024898a;
          }
          goto LAB_0024896b;
        }
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        if (c_00 < c) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\tcache0 > cache1\n",0x12);
          puVar1 = *local_a8;
          if (puVar1 != (uchar *)0x0) {
            puVar2 = *local_b0;
            if (puVar2 != (uchar *)0x0) {
              iVar3 = strcmp((char *)puVar1,(char *)puVar2);
              if (iVar3 < 1) {
                __assert_fail("cmp(*from0, *from1) > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                              ,0x4d6,
                              "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                             );
              }
              if (((c & 0xff00) != 0) && ((c & 0xff00) == (c_00 & 0xff00))) {
                if (puVar1[local_c8 + 1] == '\0') {
                  c = 0;
                  local_c8 = local_c8 + 1;
                }
                else {
                  c = CONCAT11(puVar1[local_c8 + 1],puVar1[local_c8 + 2]);
                  local_c8 = local_c8 + 1;
                }
              }
              *__dest = puVar2;
              *lcp_result = uVar5;
              goto LAB_00248264;
            }
            goto LAB_0024898a;
          }
          goto LAB_0024896b;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\tcache0 == cache1\n",0x13);
        if ((char)c == '\0') {
          puVar1 = *local_a8;
          if (puVar1 == (uchar *)0x0) goto LAB_0024896b;
          if (*local_b0 == (uchar *)0x0) goto LAB_0024898a;
          iVar3 = strcmp((char *)puVar1,(char *)*local_b0);
          if (iVar3 != 0) {
            __assert_fail("cmp(*from0, *from1) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4e7,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                         );
          }
          *__dest = puVar1;
          *lcp_result = local_c8;
          *puVar7 = c;
          if (c != 0) goto LAB_00248a63;
          local_c8 = *local_b8;
          c = *local_a0;
          c_00 = 0;
        }
        else {
          compare((uchar *)&local_70,*local_a8,(size_t)*local_b0);
          uVar5 = CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_);
          if (-1 < (int)local_70._M_string_length) {
            if ((int)local_70._M_string_length == 0) {
              *__dest = *local_a8;
              *lcp_result = local_c8;
              *puVar7 = c;
              local_c8 = *local_b8;
              c = *local_a0;
              c_00 = 0;
              goto LAB_002481c6;
            }
            *__dest = *local_b0;
            *lcp_result = local_c8;
            *puVar7 = c;
            puVar1 = *local_a8;
            if (puVar1 != (uchar *)0x0) {
              if (puVar1[uVar5] == '\0') {
                c = 0;
              }
              else {
                c = CONCAT11(puVar1[uVar5],puVar1[uVar5 + 1]);
              }
              lVar8 = *local_90;
              c_00 = *local_98;
              local_c8 = uVar5;
              goto LAB_002482a0;
            }
            goto LAB_00248a25;
          }
          *__dest = *local_a8;
          *lcp_result = local_c8;
          *puVar7 = c;
          puVar1 = *local_b0;
          if (puVar1 == (uchar *)0x0) goto LAB_00248a25;
          if (puVar1[uVar5] == '\0') {
            c_00 = 0;
          }
          else {
            c_00 = CONCAT11(puVar1[uVar5],puVar1[uVar5 + 1]);
          }
          local_c8 = *local_b8;
          c = *local_a0;
        }
      }
LAB_002481c6:
      local_a0 = local_a0 + 1;
      local_a8 = local_a8 + 1;
      local_b8 = local_b8 + 1;
      puVar7 = puVar7 + 1;
      lcp_result = lcp_result + 1;
      __dest = __dest + 1;
      local_c0 = local_c0 - 1;
      if (local_c0 == 0) goto LAB_00248899;
      goto LAB_00247dc9;
    }
    puVar7 = cache_result + 1;
    __dest = result + 1;
  }
  else {
    compare((uchar *)&local_70,*from0,(size_t)*from1);
    uVar5 = CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_);
    if ((int)local_70._M_string_length < 0) {
      *result = *from0;
      *cache_result = c;
      puVar1 = *from1;
      if (puVar1 == (uchar *)0x0) {
LAB_00248a25:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar1[uVar5] == '\0') {
        c_00 = 0;
      }
      else {
        c_00 = CONCAT11(puVar1[uVar5],puVar1[uVar5 + 1]);
      }
      goto joined_r0x00247ccf;
    }
    __dest = result + 1;
    puVar7 = cache_result + 1;
    if ((int)local_70._M_string_length != 0) {
      *result = *from1;
      *cache_result = c_00;
      puVar1 = *from0;
      if (puVar1 == (uchar *)0x0) goto LAB_00248a25;
      if (puVar1[uVar5] == '\0') {
        c = 0;
      }
      else {
        c = CONCAT11(puVar1[uVar5],puVar1[uVar5 + 1]);
      }
      local_80 = n1 - 1;
      local_c8 = uVar5;
      if (local_80 != 0) {
        local_b0 = from1 + 1;
        uVar5 = *lcp_input1;
        local_90 = lcp_input1 + 1;
        c_00 = cache_input1[1];
        local_98 = cache_input1 + 2;
        goto LAB_00247dc1;
      }
      goto LAB_00248748;
    }
    *result = *from0;
    *cache_result = c;
    c_00 = 0;
    if (n0 != 1) {
      local_c8 = *lcp_input0;
      c = cache_input0[1];
      goto LAB_00247d07;
    }
  }
LAB_00248899:
  if (local_80 == 0) {
    __assert_fail("n1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x51e,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                 );
  }
  *lcp_result = uVar5;
  *puVar7 = c_00;
  memmove(__dest,local_b0,local_80 * 8);
  memmove(lcp_result + 1,local_90,local_80 * 8);
LAB_002488eb:
  memmove(puVar7 + 1,local_98,local_80 * 2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  local_70._M_dataplus._M_p._0_1_ = 0x7e;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_70,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"merge_cache_lcp_2way",0x14);
  local_70._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_70,1);
  return;
}

Assistant:

void
merge_cache_lcp_2way(
       unsigned char** from0,  lcp_t* restrict lcp_input0, CharT* restrict cache_input0, size_t n0,
       unsigned char** from1,  lcp_t* restrict lcp_input1, CharT* restrict cache_input1, size_t n1,
       unsigned char** result, lcp_t* restrict lcp_result, CharT* restrict cache_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';

	check_input(from0, lcp_input0, cache_input0, n0);
	check_input(from1, lcp_input1, cache_input1, n1);

	lcp_t lcp0=0, lcp1=0;
	CharT cache0 = *cache_input0++;
	CharT cache1 = *cache_input1++;
	{
		stat_try_cache();
		if (cache0 < cache1) {
			assert(cmp(*from0, *from1) < 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache1 = get_char<CharT>(*from1, l);
				}
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				lcp1 = l;
				cache0 = *cache_input0++;
			} else {
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
			}
			if (--n0 == 0) goto finish0;
		} else if (cache0 > cache1) {
			assert(cmp(*from0, *from1) > 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache0 = get_char<CharT>(*from0, l);
				}
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp0 = l;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			}
			if (--n1 == 0) goto finish1;
		} else {
			if (is_end(cache0)) {
				assert(cmp(*from0, *from1) == 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = l;
					cache0 = *cache_input0++;
					cache1 = 0;
				} else {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					cache0 = *cache_input0++;
					cache1 = 0;
				}
				if (--n0 == 0) goto finish0;
			} else {
				stat_cache_useless();
				int cmp01; lcp_t lcp01;
				std::tie(cmp01, lcp01) = compare(*from0, *from1, sizeof(CharT));
				if (cmp01 < 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = get_char<CharT>(*from1, lcp01);
					if (--n0 == 0) goto finish0;
				} else if (cmp01 == 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = 0;
					if (--n0 == 0) goto finish0;
				} else {
					*result++ = *from1++;
					if (OutputLCP) *cache_result++ = cache1;
					lcp0 = lcp01;
					lcp1 = *lcp_input1++;
					cache0 = get_char<CharT>(*from0, lcp01);
					cache1 = *cache_input1++;
					if (--n1 == 0) goto finish1;
				}
			}
		}
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
			<< "\tprev   = '"<<*(result-1)<<"'\n"
			<< "\t*from0 = '"<<*from0<<"'\n"
			<< "\t*from1 = '"<<*from1<<"'\n"
			<< "\tlcp0   = " <<lcp0<<"\n"
			<< "\tlcp1   = " <<lcp1<<"\n"
			<< "\tcache0 = '"<<to_str(cache0)<<"'\n"
			<< "\tcache1 = '"<<to_str(cache1)<<"'\n"
			<< "\n";
		check_lcp_and_cache(*(result-1),*from0,lcp0,cache0,*from1,lcp1,cache1);
		if (lcp0 > lcp1) {
			debug() << "\tlcp0 > lcp1\n";
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			if (OutputLCP) *cache_result++ = cache0;
			lcp0 = *lcp_input0++;
			cache0 = *cache_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			debug() << "\tlcp0 < lcp1\n";
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			if (OutputLCP) *cache_result++ = cache1;
			lcp1 = *lcp_input1++;
			cache1 = *cache_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			debug() << "\tlcp0 == lcp1\n";
			stat_try_cache();
			// Both strings in the sorted sequences have the same
			// prefix than the latest string in output. Check
			// cached characters first.
			if (cache0 < cache1) {
				debug() << "\t\tcache0 < cache1\n";
				assert(cmp(*from0, *from1) < 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp1 += l;
						cache1 = get_char<CharT>(*from1, lcp1);
					}
				}
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
				if (--n0 == 0) goto finish0;
			} else if (cache0 > cache1) {
				debug() << "\t\tcache0 > cache1\n";
				assert(cmp(*from0, *from1) > 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp0 += l;
						cache0 = get_char<CharT>(*from0, lcp0);
					}
				}
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp1;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
				if (--n1 == 0) goto finish1;
			} else {
				debug() << "\t\tcache0 == cache1\n";
				if (is_end(cache0)) {
					assert(cmp(*from0, *from1) == 0);
					if (sizeof(CharT) > 1) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 += lcp(cache0, cache1);
						cache0 = *cache_input0++;
						cache1 = 0;
					} else {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						cache0 = *cache_input0++;
					}
					if (--n0 == 0) goto finish0;
				} else {
					stat_cache_useless();
					int cmp01; lcp_t lcp01;
					std::tie(cmp01, lcp01) = compare(*from0, *from1, lcp0+sizeof(CharT));
					if (cmp01 < 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = get_char<CharT>(*from1, lcp01);
						if (--n0 == 0) goto finish0;
					} else if (cmp01 == 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = 0;
						if (--n0 == 0) goto finish0;
					} else {
						*result++ = *from1++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = lcp01;
						lcp1 = *lcp_input1++;
						cache0 = get_char<CharT>(*from0, lcp01);
						cache1 = *cache_input1++;
						if (--n1 == 0) goto finish1;
					}
				}
			}
		}
	}
finish0:
	assert(n0==0);
	assert(n1);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) *cache_result++ = cache1;
	std::copy(from1, from1+n1, result);
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	if (OutputLCP) std::copy(cache_input1, cache_input1+n1, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
finish1:
	assert(n0);
	assert(n1==0);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) *cache_result++ = cache0;
	std::copy(from0, from0+n0, result);
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	if (OutputLCP) std::copy(cache_input0, cache_input0+n0, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
}